

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorSet::Clear(FileDescriptorSet *this)

{
  InternalMetadataWithArena *in_RDI;
  uint32 cached_has_bits;
  
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::Clear
            ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)0x4fd124);
  memset(in_RDI + 2,0,4);
  if (((uint)in_RDI[1].
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear(in_RDI);
  }
  return;
}

Assistant:

void FileDescriptorSet::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorSet)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  file_.Clear();
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}